

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_hooktask.cc
# Opt level: O0

void HookTask::initialize(search *sch,size_t *num_actions,options_i *param_3)

{
  task_data *data;
  size_t *in_RSI;
  search *in_RDI;
  task_data *td;
  
  data = (task_data *)operator_new(0x60);
  data->run_f = (_func_void_search_ptr *)0x0;
  data->run_setup_f = (_func_void_search_ptr *)0x0;
  data->run_takedown_f = (_func_void_search_ptr *)0x0;
  data->run_object = (void *)0x0;
  data->setup_object = (void *)0x0;
  data->takedown_object = (void *)0x0;
  data->delete_run_object = (_func_void_void_ptr *)0x0;
  data->delete_extra_data = (_func_void_task_data_ptr *)0x0;
  data->num_actions = *in_RSI;
  Search::search::set_task_data<HookTask::task_data>(in_RDI,data);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i&)
{
  task_data* td = new task_data;
  td->run_f = nullptr;
  td->run_setup_f = nullptr;
  td->run_takedown_f = nullptr;
  td->run_object = nullptr;
  td->setup_object = nullptr;
  td->takedown_object = nullptr;
  td->delete_run_object = nullptr;
  td->delete_extra_data = nullptr;
  td->num_actions = num_actions;
  sch.set_task_data<task_data>(td);
}